

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void synchronize_regions(bool is_moving_window_iteration)

{
  int iVar1;
  int nm1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,is_moving_window_iteration);
  nm1 = nm - iVar1;
  iVar1 = nm + iVar1;
  exchange_fields(nm1,iVar1);
  exchange_particles(nm1,iVar1);
  return;
}

Assistant:

void synchronize_regions(bool is_moving_window_iteration) {
    int nm1, nm2;
    if (is_moving_window_iteration) {
        nm1 = nm-1;
        nm2 = nm+1;
    } else {
        nm1 = nm;
        nm2 = nm;
    }

    exchange_fields(nm1, nm2);
    exchange_particles(nm1, nm2);
}